

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::compiler::Version::InternalSerializeWithCachedSizesToArray
          (Version *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint32 uVar1;
  int size;
  char *data;
  undefined8 in_RDX;
  EpsCopyOutputStream *in_RSI;
  Version *in_RDI;
  uint32 cached_has_bits;
  uint8 **in_stack_fffffffffffffeb8;
  EpsCopyOutputStream *in_stack_fffffffffffffec0;
  int32 value;
  undefined4 in_stack_fffffffffffffee0;
  uint uVar2;
  uint32 num;
  EpsCopyOutputStream *stream_00;
  uint8 *in_stack_ffffffffffffff10;
  int32 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  
  num = (uint32)((ulong)in_RDX >> 0x20);
  stream_00 = (EpsCopyOutputStream *)&in_RDI->_has_bits_;
  uVar2 = ((HasBits<1UL> *)stream_00)->has_bits_[0];
  if ((uVar2 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    _internal_major(in_RDI);
    uVar1 = internal::WireFormatLite::MakeTag(1,WIRETYPE_VARINT);
    io::CodedOutputStream::WriteVarint32ToArray(uVar1,(uint8 *)in_RSI);
    in_RSI = (EpsCopyOutputStream *)
             io::CodedOutputStream::WriteVarint32SignExtendedToArray
                       ((int32)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                        (uint8 *)in_stack_fffffffffffffeb8);
  }
  if ((uVar2 & 4) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    _internal_minor(in_RDI);
    uVar1 = internal::WireFormatLite::MakeTag(2,WIRETYPE_VARINT);
    io::CodedOutputStream::WriteVarint32ToArray(uVar1,(uint8 *)in_RSI);
    in_RSI = (EpsCopyOutputStream *)
             io::CodedOutputStream::WriteVarint32SignExtendedToArray
                       ((int32)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                        (uint8 *)in_stack_fffffffffffffeb8);
  }
  if ((uVar2 & 8) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    value = (int32)((ulong)in_stack_fffffffffffffec0 >> 0x20);
    in_stack_ffffffffffffff18 = _internal_patch(in_RDI);
    in_stack_ffffffffffffff1c = 3;
    uVar1 = internal::WireFormatLite::MakeTag(3,WIRETYPE_VARINT);
    in_stack_ffffffffffffff10 = io::CodedOutputStream::WriteVarint32ToArray(uVar1,(uint8 *)in_RSI);
    in_RSI = (EpsCopyOutputStream *)
             io::CodedOutputStream::WriteVarint32SignExtendedToArray
                       (value,(uint8 *)in_stack_fffffffffffffeb8);
  }
  if ((uVar2 & 1) != 0) {
    _internal_suffix_abi_cxx11_((Version *)0x4b0d6a);
    data = (char *)std::__cxx11::string::data();
    _internal_suffix_abi_cxx11_((Version *)0x4b0d81);
    size = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (data,size,SERIALIZE,"google.protobuf.compiler.Version.suffix");
    _internal_suffix_abi_cxx11_((Version *)0x4b0db5);
    in_RSI = (EpsCopyOutputStream *)
             io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (in_RSI,num,(string *)CONCAT44(uVar2,in_stack_fffffffffffffee0),
                        (uint8 *)in_RDI);
  }
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    if (((uint)(in_RDI->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)&in_RDI->_internal_metadata_);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    in_RSI = (EpsCopyOutputStream *)
             internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)
                        CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                        in_stack_ffffffffffffff10,stream_00);
  }
  return (uint8 *)in_RSI;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* Version::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.Version)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 major = 1;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(1, this->_internal_major(), target);
  }

  // optional int32 minor = 2;
  if (cached_has_bits & 0x00000004u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(2, this->_internal_minor(), target);
  }

  // optional int32 patch = 3;
  if (cached_has_bits & 0x00000008u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(3, this->_internal_patch(), target);
  }

  // optional string suffix = 4;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_suffix().data(), static_cast<int>(this->_internal_suffix().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.Version.suffix");
    target = stream->WriteStringMaybeAliased(
        4, this->_internal_suffix(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.Version)
  return target;
}